

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

uint32_t * __thiscall spirv_cross::Compiler::stream(Compiler *this,Instruction *instr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  size_t sVar4;
  size_type sVar5;
  CompilerError *this_00;
  allocator local_49;
  string local_48 [32];
  EmbeddedInstruction *local_28;
  EmbeddedInstruction *embedded;
  Instruction *instr_local;
  Compiler *this_local;
  
  if (instr->length == 0) {
    this_local = (Compiler *)0x0;
  }
  else {
    embedded = (EmbeddedInstruction *)instr;
    instr_local = (Instruction *)this;
    bVar3 = Instruction::is_embedded(instr);
    if (bVar3) {
      local_28 = embedded;
      sVar4 = VectorView<unsigned_int>::size(&(embedded->ops).super_VectorView<unsigned_int>);
      if (sVar4 != (embedded->super_Instruction).length) {
        __assert_fail("embedded.ops.size() == instr.length",
                      "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_cross.hpp"
                      ,0x22a,
                      "const uint32_t *spirv_cross::Compiler::stream(const Instruction &) const");
      }
      this_local = (Compiler *)
                   VectorView<unsigned_int>::data(&(local_28->ops).super_VectorView<unsigned_int>);
    }
    else {
      uVar1 = (embedded->super_Instruction).offset;
      uVar2 = (embedded->super_Instruction).length;
      sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(this->ir).spirv);
      if (sVar5 < uVar1 + uVar2) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_48,"Compiler::stream() out of range.",&local_49);
        CompilerError::CompilerError(this_00,(string *)local_48);
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      this_local = (Compiler *)
                   ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&(this->ir).spirv,(ulong)(embedded->super_Instruction).offset);
    }
  }
  return (uint32_t *)this_local;
}

Assistant:

const uint32_t *stream(const Instruction &instr) const
	{
		// If we're not going to use any arguments, just return nullptr.
		// We want to avoid case where we return an out of range pointer
		// that trips debug assertions on some platforms.
		if (!instr.length)
			return nullptr;

		if (instr.is_embedded())
		{
			auto &embedded = static_cast<const EmbeddedInstruction &>(instr);
			assert(embedded.ops.size() == instr.length);
			return embedded.ops.data();
		}
		else
		{
			if (instr.offset + instr.length > ir.spirv.size())
				SPIRV_CROSS_THROW("Compiler::stream() out of range.");
			return &ir.spirv[instr.offset];
		}
	}